

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void ptls_log__recalc_conn
               (int caller_locked,st_ptls_log_conn_state_t *conn,_func_char_ptr_void_ptr *get_sni,
               void *get_sni_arg)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  in6_addr *element;
  in6_addr *piVar4;
  size_t slot;
  long lVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  char *local_38;
  
  if (caller_locked == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  }
  if ((conn->state).generation != ptls_log._generation) {
    uVar3 = 0;
    if (get_sni == (_func_char_ptr_void_ptr *)0x0) {
      local_38 = (char *)0x0;
    }
    else {
      local_38 = (*get_sni)(get_sni_arg);
    }
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
      if (((logctx.conns[lVar5].points != (char *)0x0) &&
          (fVar1 = logctx.conns[lVar5].sample_ratio,
          conn->random_ <= fVar1 && fVar1 != conn->random_)) &&
         (iVar2 = is_in_stringlist(logctx.conns[lVar5].snis,local_38), iVar2 != 0)) {
        piVar4 = logctx.conns[lVar5].addresses;
        uVar6 = in6addr_any;
        auVar22[0] = -((piVar4->__in6_u).__u6_addr8[0] == uVar6);
        uVar7 = in6addr_any._1_1_;
        auVar22[1] = -((piVar4->__in6_u).__u6_addr8[1] == uVar7);
        uVar8 = in6addr_any._2_1_;
        auVar22[2] = -((piVar4->__in6_u).__u6_addr8[2] == uVar8);
        uVar9 = in6addr_any._3_1_;
        auVar22[3] = -((piVar4->__in6_u).__u6_addr8[3] == uVar9);
        uVar10 = in6addr_any._4_1_;
        auVar22[4] = -((piVar4->__in6_u).__u6_addr8[4] == uVar10);
        uVar11 = in6addr_any._5_1_;
        auVar22[5] = -((piVar4->__in6_u).__u6_addr8[5] == uVar11);
        uVar12 = in6addr_any._6_1_;
        auVar22[6] = -((piVar4->__in6_u).__u6_addr8[6] == uVar12);
        uVar13 = in6addr_any._7_1_;
        auVar22[7] = -((piVar4->__in6_u).__u6_addr8[7] == uVar13);
        uVar14 = in6addr_any._8_1_;
        auVar22[8] = -((piVar4->__in6_u).__u6_addr8[8] == uVar14);
        uVar15 = in6addr_any._9_1_;
        auVar22[9] = -((piVar4->__in6_u).__u6_addr8[9] == uVar15);
        uVar16 = in6addr_any._10_1_;
        auVar22[10] = -((piVar4->__in6_u).__u6_addr8[10] == uVar16);
        uVar17 = in6addr_any._11_1_;
        auVar22[0xb] = -((piVar4->__in6_u).__u6_addr8[0xb] == uVar17);
        uVar18 = in6addr_any._12_1_;
        auVar22[0xc] = -((piVar4->__in6_u).__u6_addr8[0xc] == uVar18);
        uVar19 = in6addr_any._13_1_;
        auVar22[0xd] = -((piVar4->__in6_u).__u6_addr8[0xd] == uVar19);
        uVar20 = in6addr_any._14_1_;
        auVar22[0xe] = -((piVar4->__in6_u).__u6_addr8[0xe] == uVar20);
        uVar21 = in6addr_any._15_1_;
        auVar22[0xf] = -((piVar4->__in6_u).__u6_addr8[0xf] == uVar21);
        if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar22[0xf] >> 7) << 0xf) != 0xffff) {
          auVar23[0] = -((conn->address).__in6_u.__u6_addr8[0] == uVar6);
          auVar23[1] = -((conn->address).__in6_u.__u6_addr8[1] == uVar7);
          auVar23[2] = -((conn->address).__in6_u.__u6_addr8[2] == uVar8);
          auVar23[3] = -((conn->address).__in6_u.__u6_addr8[3] == uVar9);
          auVar23[4] = -((conn->address).__in6_u.__u6_addr8[4] == uVar10);
          auVar23[5] = -((conn->address).__in6_u.__u6_addr8[5] == uVar11);
          auVar23[6] = -((conn->address).__in6_u.__u6_addr8[6] == uVar12);
          auVar23[7] = -((conn->address).__in6_u.__u6_addr8[7] == uVar13);
          auVar23[8] = -((conn->address).__in6_u.__u6_addr8[8] == uVar14);
          auVar23[9] = -((conn->address).__in6_u.__u6_addr8[9] == uVar15);
          auVar23[10] = -((conn->address).__in6_u.__u6_addr8[10] == uVar16);
          auVar23[0xb] = -((conn->address).__in6_u.__u6_addr8[0xb] == uVar17);
          auVar23[0xc] = -((conn->address).__in6_u.__u6_addr8[0xc] == uVar18);
          auVar23[0xd] = -((conn->address).__in6_u.__u6_addr8[0xd] == uVar19);
          auVar23[0xe] = -((conn->address).__in6_u.__u6_addr8[0xe] == uVar20);
          auVar23[0xf] = -((conn->address).__in6_u.__u6_addr8[0xf] == uVar21);
          if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar23[0xf] >> 7) << 0xf) == 0xffff) goto LAB_0011c3cf;
          do {
            auVar24[0] = -((piVar4->__in6_u).__u6_addr8[0] == uVar6);
            auVar24[1] = -((piVar4->__in6_u).__u6_addr8[1] == uVar7);
            auVar24[2] = -((piVar4->__in6_u).__u6_addr8[2] == uVar8);
            auVar24[3] = -((piVar4->__in6_u).__u6_addr8[3] == uVar9);
            auVar24[4] = -((piVar4->__in6_u).__u6_addr8[4] == uVar10);
            auVar24[5] = -((piVar4->__in6_u).__u6_addr8[5] == uVar11);
            auVar24[6] = -((piVar4->__in6_u).__u6_addr8[6] == uVar12);
            auVar24[7] = -((piVar4->__in6_u).__u6_addr8[7] == uVar13);
            auVar24[8] = -((piVar4->__in6_u).__u6_addr8[8] == uVar14);
            auVar24[9] = -((piVar4->__in6_u).__u6_addr8[9] == uVar15);
            auVar24[10] = -((piVar4->__in6_u).__u6_addr8[10] == uVar16);
            auVar24[0xb] = -((piVar4->__in6_u).__u6_addr8[0xb] == uVar17);
            auVar24[0xc] = -((piVar4->__in6_u).__u6_addr8[0xc] == uVar18);
            auVar24[0xd] = -((piVar4->__in6_u).__u6_addr8[0xd] == uVar19);
            auVar24[0xe] = -((piVar4->__in6_u).__u6_addr8[0xe] == uVar20);
            auVar24[0xf] = -((piVar4->__in6_u).__u6_addr8[0xf] == uVar21);
            if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) goto LAB_0011c3cf;
            auVar25[0] = -((piVar4->__in6_u).__u6_addr8[0] == (conn->address).__in6_u.__u6_addr8[0])
            ;
            auVar25[1] = -((piVar4->__in6_u).__u6_addr8[1] == (conn->address).__in6_u.__u6_addr8[1])
            ;
            auVar25[2] = -((piVar4->__in6_u).__u6_addr8[2] == (conn->address).__in6_u.__u6_addr8[2])
            ;
            auVar25[3] = -((piVar4->__in6_u).__u6_addr8[3] == (conn->address).__in6_u.__u6_addr8[3])
            ;
            auVar25[4] = -((piVar4->__in6_u).__u6_addr8[4] == (conn->address).__in6_u.__u6_addr8[4])
            ;
            auVar25[5] = -((piVar4->__in6_u).__u6_addr8[5] == (conn->address).__in6_u.__u6_addr8[5])
            ;
            auVar25[6] = -((piVar4->__in6_u).__u6_addr8[6] == (conn->address).__in6_u.__u6_addr8[6])
            ;
            auVar25[7] = -((piVar4->__in6_u).__u6_addr8[7] == (conn->address).__in6_u.__u6_addr8[7])
            ;
            auVar25[8] = -((piVar4->__in6_u).__u6_addr8[8] == (conn->address).__in6_u.__u6_addr8[8])
            ;
            auVar25[9] = -((piVar4->__in6_u).__u6_addr8[9] == (conn->address).__in6_u.__u6_addr8[9])
            ;
            auVar25[10] = -((piVar4->__in6_u).__u6_addr8[10] ==
                           (conn->address).__in6_u.__u6_addr8[10]);
            auVar25[0xb] = -((piVar4->__in6_u).__u6_addr8[0xb] ==
                            (conn->address).__in6_u.__u6_addr8[0xb]);
            auVar25[0xc] = -((piVar4->__in6_u).__u6_addr8[0xc] ==
                            (conn->address).__in6_u.__u6_addr8[0xc]);
            auVar25[0xd] = -((piVar4->__in6_u).__u6_addr8[0xd] ==
                            (conn->address).__in6_u.__u6_addr8[0xd]);
            auVar25[0xe] = -((piVar4->__in6_u).__u6_addr8[0xe] ==
                            (conn->address).__in6_u.__u6_addr8[0xe]);
            auVar25[0xf] = -((piVar4->__in6_u).__u6_addr8[0xf] ==
                            (conn->address).__in6_u.__u6_addr8[0xf]);
            piVar4 = piVar4 + 1;
          } while ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                           (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff);
        }
        uVar3 = uVar3 | 1 << ((uint)lVar5 & 0x1f);
      }
LAB_0011c3cf:
    }
    (conn->state).active_conns = uVar3;
    (conn->state).generation = ptls_log._generation;
  }
  if (caller_locked == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
    return;
  }
  return;
}

Assistant:

void ptls_log__recalc_conn(int caller_locked, struct st_ptls_log_conn_state_t *conn, const char *(*get_sni)(void *),
                           void *get_sni_arg)
{
    if (!caller_locked)
        pthread_mutex_lock(&logctx.mutex);

    if (conn->state.generation != ptls_log._generation) {
        /* update active bitmap */
        uint32_t new_active = 0;
        const char *sni = get_sni != NULL ? get_sni(get_sni_arg) : NULL;
        for (size_t slot = 0; slot < PTLS_ELEMENTSOF(logctx.conns); ++slot) {
            if (logctx.conns[slot].points != NULL && conn->random_ < logctx.conns[slot].sample_ratio &&
                is_in_stringlist(logctx.conns[slot].snis, sni) && is_in_addresslist(logctx.conns[slot].addresses, &conn->address)) {
                new_active |= (uint32_t)1 << slot;
            }
        }
        conn->state.active_conns = new_active;
        conn->state.generation = ptls_log._generation;
    }

    if (!caller_locked)
        pthread_mutex_unlock(&logctx.mutex);
}